

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<true>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  pointer ppVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  size_t sVar5;
  Lattice *lattice_00;
  unsigned_short uVar6;
  int iVar7;
  CharInfo CVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *key;
  mecab_node_t *pmVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar10;
  CharInfo CVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  unsigned_short uVar16;
  result_type *prVar17;
  char *pcVar18;
  Token *pTVar19;
  pointer ppDVar20;
  bool bVar21;
  CharInfo cinfo;
  mecab_node_t *local_b0;
  mecab_node_t *new_node;
  Allocator<mecab_node_t,_mecab_path_t> *local_90;
  char *local_88;
  char *local_80;
  size_t mblen;
  Lattice *local_70;
  char *local_68;
  char *local_60;
  Dictionary *local_58;
  result_type *local_50;
  size_t clen;
  CharProperty *local_40;
  CharInfo fail;
  
  cinfo = (CharInfo)0x0;
  mblen = 0;
  clen = 0;
  pcVar18 = begin + 0xffff;
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    pcVar18 = end;
  }
  local_90 = allocator;
  iVar7 = (*lattice->_vptr_Lattice[8])(lattice);
  uVar13 = (long)begin - CONCAT44(extraout_var,iVar7);
  local_88 = begin;
  local_70 = lattice;
  do {
    uVar13 = uVar13 + 1;
    iVar7 = (*lattice->_vptr_Lattice[0xb])(lattice);
    if (CONCAT44(extraout_var_00,iVar7) <= uVar13) goto LAB_001242e1;
    iVar7 = (*lattice->_vptr_Lattice[0x1f])(lattice,uVar13);
  } while (iVar7 != 1);
  iVar7 = (*lattice->_vptr_Lattice[8])(lattice);
  pcVar18 = (char *)(CONCAT44(extraout_var_01,iVar7) + uVar13);
LAB_001242e1:
  pcVar15 = local_88;
  local_40 = &this->property_;
  key = CharProperty::seekToOtherType(local_40,local_88,pcVar18,this->space_,&cinfo,&mblen,&clen);
  local_50 = (local_90->results_).ptr_;
  ppDVar20 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_60 = (char *)((long)pcVar18 - (long)key);
  sVar2 = (short)key;
  local_b0 = (mecab_node_t *)0x0;
  local_68 = pcVar18;
  for (; sVar5 = mblen,
      ppDVar20 !=
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppDVar20 = ppDVar20 + 1) {
    local_80 = (char *)Dictionary::commonPrefixSearch(*ppDVar20,key,(size_t)local_60,local_50,0x200)
    ;
    pcVar18 = (char *)0x0;
    while (prVar17 = local_50, pcVar18 != local_80) {
      uVar13 = (ulong)(local_50[(long)pcVar18].value & 0xff);
      pTVar19 = (*ppDVar20)->token_ + (local_50[(long)pcVar18].value >> 8);
      local_58 = (Dictionary *)pcVar18;
      while (bVar21 = uVar13 != 0, uVar13 = uVar13 - 1, bVar21) {
        pmVar9 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_90);
        new_node = pmVar9;
        anon_unknown_23::read_node_info(*ppDVar20,pTVar19,&new_node);
        uVar6 = (unsigned_short)prVar17[(long)pcVar18].length;
        pmVar9->length = uVar6;
        pmVar9->rlength = uVar6 + (sVar2 - (short)pcVar15);
        pmVar9->surface = key;
        pmVar9->stat = '\0';
        pmVar9->char_type = (uchar)((uint)cinfo >> 0x12);
        bVar21 = anon_unknown_23::is_valid_node<mecab_node_t>(local_70,pmVar9);
        if (bVar21) {
          pmVar9->bnext = local_b0;
          local_b0 = pmVar9;
        }
        pTVar19 = pTVar19 + 1;
      }
      pcVar18 = (char *)((long)local_58 + 1);
    }
  }
  if (local_b0 != (mecab_node_t *)0x0 && -1 < (int)cinfo) {
    return local_b0;
  }
  pcVar18 = key + mblen;
  if (local_68 < pcVar18) {
    ppVar1 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)((uint)cinfo >> 0xe & 0xff0);
    pTVar19 = *(Token **)((long)&ppVar1->first + uVar13);
    lVar14 = *(long *)((long)&ppVar1->second + uVar13);
    sVar3 = (short)local_88;
    local_80 = pcVar18;
    while (bVar21 = lVar14 != 0, lVar14 = lVar14 + -1, bVar21) {
      pmVar9 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_90);
      new_node = pmVar9;
      anon_unknown_23::read_node_info(&this->unkdic_,pTVar19,&new_node);
      pmVar9->char_type = (uchar)((uint)cinfo >> 0x12);
      pmVar9->surface = key;
      pmVar9->length = (unsigned_short)sVar5;
      pmVar9->rlength = (short)pcVar18 - sVar3;
      pmVar9->stat = '\x01';
      pmVar9->bnext = local_b0;
      pcVar15 = (this->unk_feature_).super_scoped_array<char>.ptr_;
      if (pcVar15 != (char *)0x0) {
        pmVar9->feature = pcVar15;
      }
      bVar21 = anon_unknown_23::is_valid_node<mecab_node_t>(local_70,pmVar9);
      if (bVar21) {
        local_b0 = pmVar9;
      }
      pTVar19 = pTVar19 + 1;
    }
    if (local_b0 != (mecab_node_t *)0x0) {
      return local_b0;
    }
    local_b0 = (mecab_node_t *)0x0;
    pcVar18 = local_80;
  }
  pcVar15 = local_68;
  if (((uint)cinfo >> 0x1e & 1) == 0) {
    pcVar12 = (char *)0x0;
  }
  else {
    fail = (CharInfo)0x0;
    local_60 = CharProperty::seekToOtherType(local_40,pcVar18,local_68,cinfo,&fail,&mblen,&clen);
    pcVar12 = local_60;
    if (clen <= this->max_grouping_size_) {
      ppVar1 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (ulong)((uint)cinfo >> 0xe & 0xff0);
      pTVar19 = *(Token **)((long)&ppVar1->first + uVar13);
      lVar14 = *(long *)((long)&ppVar1->second + uVar13);
      sVar3 = (short)local_60;
      sVar4 = (short)local_88;
      local_80 = pcVar18;
      while (bVar21 = lVar14 != 0, lVar14 = lVar14 + -1, pcVar12 = local_60, pcVar15 = local_68,
            pcVar18 = local_80, bVar21) {
        pmVar9 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_90);
        new_node = pmVar9;
        anon_unknown_23::read_node_info(&this->unkdic_,pTVar19,&new_node);
        pmVar9->char_type = (uchar)((uint)cinfo >> 0x12);
        pmVar9->surface = key;
        pmVar9->length = sVar3 - sVar2;
        pmVar9->rlength = sVar3 - sVar4;
        pmVar9->stat = '\x01';
        pmVar9->bnext = local_b0;
        pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar18 != (char *)0x0) {
          pmVar9->feature = pcVar18;
        }
        bVar21 = anon_unknown_23::is_valid_node<mecab_node_t>(local_70,pmVar9);
        if (bVar21) {
          local_b0 = pmVar9;
        }
        pTVar19 = pTVar19 + 1;
      }
    }
  }
  local_58 = &this->unkdic_;
  prVar17 = (result_type *)0x1;
  CVar11 = cinfo;
  local_60 = pcVar12;
  do {
    if (((result_type *)(ulong)((uint)CVar11 >> 0x1a & 0xf) < prVar17) || (pcVar15 < pcVar18))
    break;
    if (pcVar18 != pcVar12) {
      ppVar1 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (ulong)((uint)CVar11 >> 0xe & 0xff0);
      pTVar19 = *(Token **)((long)&ppVar1->first + uVar13);
      lVar14 = *(long *)((long)&ppVar1->second + uVar13);
      sVar3 = (short)pcVar18;
      sVar4 = (short)local_88;
      local_80 = pcVar18;
      local_50 = prVar17;
      clen = (size_t)prVar17;
      while (pcVar15 = local_68, pcVar18 = local_80, bVar21 = lVar14 != 0, lVar14 = lVar14 + -1,
            bVar21) {
        pmVar9 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_90);
        new_node = pmVar9;
        anon_unknown_23::read_node_info(local_58,pTVar19,&new_node);
        pmVar9->char_type = (uchar)((uint)cinfo >> 0x12);
        pmVar9->surface = key;
        pmVar9->length = sVar3 - sVar2;
        pmVar9->rlength = sVar3 - sVar4;
        pmVar9->stat = '\x01';
        pmVar9->bnext = local_b0;
        pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar18 != (char *)0x0) {
          pmVar9->feature = pcVar18;
        }
        bVar21 = anon_unknown_23::is_valid_node<mecab_node_t>(local_70,pmVar9);
        if (bVar21) {
          local_b0 = pmVar9;
        }
        pTVar19 = pTVar19 + 1;
      }
      CVar8 = CharProperty::getCharInfo(local_40,local_80,local_68,&mblen);
      CVar11 = cinfo;
      if (((uint)CVar8 & (uint)cinfo & 0x3ffff) == 0) break;
      pcVar18 = pcVar18 + mblen;
      pcVar12 = local_60;
      prVar17 = local_50;
    }
    prVar17 = (result_type *)((long)&prVar17->value + 1);
  } while( true );
  if (local_b0 == (mecab_node_t *)0x0) {
    ppVar1 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)((uint)CVar11 >> 0xe & 0xff0);
    pTVar19 = *(Token **)((long)&ppVar1->first + uVar13);
    lVar14 = *(long *)((long)&ppVar1->second + uVar13);
    sVar3 = (short)local_88;
    local_b0 = (mecab_node_t *)0x0;
    while (pcVar15 = local_68, lattice_00 = local_70, bVar21 = lVar14 != 0, lVar14 = lVar14 + -1,
          bVar21) {
      pmVar9 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_90);
      new_node = pmVar9;
      anon_unknown_23::read_node_info(local_58,pTVar19,&new_node);
      pmVar9->char_type = (uchar)((uint)cinfo >> 0x12);
      pmVar9->surface = key;
      pmVar9->length = (short)pcVar18 - sVar2;
      pmVar9->rlength = (short)pcVar18 - sVar3;
      pmVar9->stat = '\x01';
      pmVar9->bnext = local_b0;
      pcVar15 = (this->unk_feature_).super_scoped_array<char>.ptr_;
      if (pcVar15 != (char *)0x0) {
        pmVar9->feature = pcVar15;
      }
      bVar21 = anon_unknown_23::is_valid_node<mecab_node_t>(local_70,pmVar9);
      if (bVar21) {
        local_b0 = pmVar9;
      }
      pTVar19 = pTVar19 + 1;
    }
    if (local_b0 == (mecab_node_t *)0x0) {
      pcVar18 = key;
      do {
        cinfo = CharProperty::getCharInfo(local_40,pcVar18,pcVar15,&mblen);
        pcVar18 = pcVar18 + mblen;
        if (pcVar15 < pcVar18) break;
        iVar7 = (*lattice_00->_vptr_Lattice[8])(lattice_00);
        iVar7 = (*lattice_00->_vptr_Lattice[0x1f])
                          (lattice_00,(long)pcVar18 - CONCAT44(extraout_var_02,iVar7));
      } while (iVar7 == 2);
      ppVar1 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (ulong)((uint)cinfo >> 0xe & 0xff0);
      pTVar19 = *(Token **)((long)&ppVar1->first + uVar13);
      lVar14 = *(long *)((long)&ppVar1->second + uVar13);
      uVar16 = (short)pcVar18 - sVar2;
      uVar6 = (short)pcVar18 - (short)local_88;
      local_b0 = (mecab_node_t *)0x0;
      while (bVar21 = lVar14 != 0, lVar14 = lVar14 + -1, bVar21) {
        pmVar9 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_90);
        new_node = pmVar9;
        anon_unknown_23::read_node_info(local_58,pTVar19,&new_node);
        pmVar9->char_type = (uchar)((uint)cinfo >> 0x12);
        pmVar9->surface = key;
        pmVar9->length = uVar16;
        pmVar9->rlength = uVar6;
        pmVar9->stat = '\x01';
        pmVar9->bnext = local_b0;
        pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar18 != (char *)0x0) {
          pmVar9->feature = pcVar18;
        }
        bVar21 = anon_unknown_23::is_valid_node<mecab_node_t>(lattice_00,pmVar9);
        if (bVar21) {
          local_b0 = pmVar9;
        }
        pTVar19 = pTVar19 + 1;
      }
      if (local_b0 == (mecab_node_t *)0x0) {
        local_b0 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_90);
        local_b0->char_type = (uchar)((uint)cinfo >> 0x12);
        local_b0->surface = key;
        local_b0->length = uVar16;
        local_b0->rlength = uVar6;
        local_b0->stat = '\x01';
        local_b0->bnext = (mecab_node_t *)0x0;
        iVar7 = (*lattice_00->_vptr_Lattice[8])(lattice_00);
        iVar7 = (*lattice_00->_vptr_Lattice[0x20])
                          (lattice_00,(long)local_88 - CONCAT44(extraout_var_03,iVar7));
        local_b0->feature = (char *)CONCAT44(extraout_var_04,iVar7);
        if ((char *)CONCAT44(extraout_var_04,iVar7) == (char *)0x0) {
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,"(");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x171);
          poVar10 = std::operator<<(poVar10,") [");
          poVar10 = std::operator<<(poVar10,"new_node->feature");
          std::operator<<(poVar10,"] ");
          die::~die((die *)&new_node);
        }
      }
    }
  }
  return local_b0;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}